

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float *pfVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  bool bVar7;
  bool bVar8;
  ImGuiID id;
  byte *pbVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  char cVar16;
  long lVar17;
  uint uVar18;
  ImGuiTableColumn *pIVar19;
  ImGuiTableColumn *pIVar20;
  ulong uVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImRect host_clip_rect;
  ImRect mouse_hit_rect;
  int local_8c;
  uint local_80;
  ImRect local_58;
  ImGuiContext *local_48;
  ImRect local_40;
  
  local_48 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x2d2,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  local_80 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar28 = (local_48->Style).FramePadding.x;
  fVar29 = 1.0;
  if (1.0 <= fVar28) {
    fVar29 = fVar28;
  }
  table->MinColumnWidth = fVar29;
  uVar18 = table->ColumnsCount;
  bVar8 = false;
  uVar24 = 0xffffffff;
  if ((int)uVar18 < 1) {
    bVar11 = true;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar25 = 0.0;
    cVar16 = '\0';
  }
  else {
    uVar21 = 0;
    local_8c = 0;
    bVar11 = false;
    fVar29 = 0.0;
    fVar28 = 0.0;
    cVar16 = bVar8;
    bVar8 = false;
    do {
      pbVar9 = (byte *)((table->DisplayOrderToIndex).Data + uVar21);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar9) goto LAB_0018ee93;
      bVar12 = *pbVar9;
      uVar18 = (uint)(char)bVar12;
      if (uVar21 != uVar18) {
        table->IsDefaultDisplayOrder = false;
      }
      if (((char)bVar12 < '\0') ||
         (pIVar19 = (table->Columns).Data + (char)bVar12, (table->Columns).DataEnd <= pIVar19))
      goto LAB_0018ee7c;
      if (table->DeclColumnsCount <= (char)bVar12) {
        TableSetupColumnFlags(table,pIVar19,0);
        pIVar19->NameOffset = -1;
        pIVar19->UserID = 0;
        pIVar19->InitStretchWeightOrWidth = -1.0;
      }
      uVar4 = table->Flags;
      if (((uVar4 & 4) == 0) || ((pIVar19->Flags & 0x40) != 0)) {
        pIVar19->IsEnabledNextFrame = true;
      }
      bVar7 = pIVar19->IsEnabledNextFrame;
      if (pIVar19->IsEnabled != bVar7) {
        pIVar19->IsEnabled = bVar7;
        table->IsSettingsDirty = true;
        if ((bVar7 == false) && (pIVar19->SortOrder != -1)) {
          table->IsSortSpecsDirty = true;
        }
      }
      if (((uVar4 >> 0x1a & 1) == 0) && ('\0' < pIVar19->SortOrder)) {
        table->IsSortSpecsDirty = true;
      }
      uVar4 = pIVar19->Flags;
      if ((&pIVar19->WidthRequest)[(ulong)((uVar4 & 8) == 0) * 2] <= 0.0 &&
          (&pIVar19->WidthRequest)[(ulong)((uVar4 & 8) == 0) * 2] != 0.0) {
        pIVar19->AutoFitQueue = '\a';
        pIVar19->CannotSkipItemsQueue = '\a';
      }
      if (pIVar19->IsEnabled == false) {
        pIVar19->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar19->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar24;
        pIVar19->NextEnabledColumn = -1;
        if (uVar24 == 0xffffffff) {
          table->LeftMostEnabledColumn = bVar12;
        }
        else {
          if (((int)uVar24 < 0) ||
             (pIVar20 = (table->Columns).Data + (int)uVar24, (table->Columns).DataEnd <= pIVar20))
          goto LAB_0018ee7c;
          pIVar20->NextEnabledColumn = bVar12;
        }
        cVar2 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar2 + '\x01';
        pIVar19->IndexWithinEnabledSet = cVar2;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar12 & 0x3f);
        bVar12 = pIVar19->DisplayOrder;
        table->EnabledMaskByDisplayOrder = table->EnabledMaskByDisplayOrder | 1L << (bVar12 & 0x3f);
        if ((char)bVar12 < cVar2) {
          __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                        ,0x31a,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar19->IsPreserveWidthAuto == false) {
          fVar25 = TableGetColumnWidthAuto(table,pIVar19);
          pIVar19->WidthAuto = fVar25;
        }
        if ((uVar4 & 0x10) == 0) {
          bVar11 = true;
        }
        if ((((uVar4 & 8) != 0) && ((uVar4 & 0x10) != 0)) &&
           (0.0 < pIVar19->InitStretchWeightOrWidth)) {
          pIVar19->WidthAuto = pIVar19->InitStretchWeightOrWidth;
        }
        if (pIVar19->AutoFitQueue != '\0') {
          bVar8 = true;
        }
        fVar25 = pIVar19->WidthAuto;
        uVar24 = uVar18;
        if ((uVar4 & 4) == 0) {
          fVar28 = (float)((uint)fVar28 & -(uint)(fVar25 <= fVar28) |
                          ~-(uint)(fVar25 <= fVar28) & (uint)fVar25);
          cVar16 = cVar16 + '\x01';
        }
        else {
          fVar29 = fVar29 + fVar25;
          local_8c = local_8c + 1;
        }
      }
      uVar21 = uVar21 + 1;
      uVar18 = table->ColumnsCount;
    } while ((long)uVar21 < (long)(int)uVar18);
    fVar25 = (float)local_8c;
    bVar11 = !bVar11;
  }
  uVar4 = table->Flags;
  if ((((uVar4 & 8) != 0) && ((uVar4 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar24;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar24 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x338,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar8) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  if ((int)uVar18 < 1) {
    fVar26 = 0.0;
    fVar30 = 0.0;
  }
  else {
    uVar21 = table->EnabledMaskByIndex;
    lVar17 = 0x62;
    uVar13 = 0;
    fVar30 = 0.0;
    fVar26 = 0.0;
    do {
      bVar12 = (byte)uVar13;
      if ((uVar21 >> (uVar13 & 0x3f) & 1) != 0) {
        pIVar19 = (table->Columns).Data;
        pIVar20 = (ImGuiTableColumn *)((long)pIVar19 + lVar17 + -0x62);
        if ((table->Columns).DataEnd <= pIVar20) goto LAB_0018ee7c;
        uVar24 = pIVar20->Flags;
        if ((uVar24 & 8) == 0) {
          if ((((uVar24 & 0x10) != 0) || (*(char *)((long)&pIVar19->Flags + lVar17) != '\0')) ||
             (pfVar1 = (float *)((long)pIVar19 + lVar17 + -0x4a), *pfVar1 <= 0.0 && *pfVar1 != 0.0))
          {
            fVar31 = *(float *)((long)pIVar19 + lVar17 + -0x46);
            bVar8 = fVar31 <= 0.0;
            if (fVar31 <= 0.0) {
              fVar31 = 1.0;
            }
            if (bVar8 && local_80 == 0x6000) {
              fVar31 = (*(float *)((long)pIVar19 + lVar17 + -0x4e) / fVar29) * fVar25;
            }
            *(float *)((long)pIVar19 + lVar17 + -0x4a) = fVar31;
          }
          fVar26 = fVar26 + *(float *)((long)pIVar19 + lVar17 + -0x4a);
          cVar2 = table->LeftMostStretchedColumn;
          if ((long)cVar2 == -1) {
LAB_0018e4aa:
            table->LeftMostStretchedColumn = bVar12;
          }
          else {
            if ((cVar2 < '\0') || ((table->Columns).DataEnd <= pIVar19 + cVar2)) goto LAB_0018ee7c;
            if (*(char *)((long)pIVar19 + lVar17 + -0x10) < pIVar19[cVar2].DisplayOrder)
            goto LAB_0018e4aa;
          }
          cVar2 = table->RightMostStretchedColumn;
          if ((long)cVar2 != -1) {
            if ((cVar2 < '\0') || ((table->Columns).DataEnd <= pIVar19 + cVar2)) goto LAB_0018ee7c;
            if (*(char *)((long)pIVar19 + lVar17 + -0x10) <= pIVar19[cVar2].DisplayOrder)
            goto LAB_0018e57c;
          }
          table->RightMostStretchedColumn = bVar12;
        }
        else {
          fVar31 = *(float *)((long)pIVar19 + lVar17 + -0x4e);
          if ((local_80 == 0x4000) &&
             (((uVar24 & 0x10) != 0 || (*(char *)((long)&pIVar19->Flags + lVar17) != '\0')))) {
            fVar31 = fVar28;
          }
          bVar3 = *(byte *)((long)&pIVar19->Flags + lVar17);
          if ((bVar3 != 0) ||
             (((uVar24 & 0x10) != 0 &&
              ((table->RequestOutputMaskByIndex & 1L << (bVar12 & 0x3f)) != 0)))) {
            *(float *)((long)pIVar19 + lVar17 + -0x52) = fVar31;
          }
          if (((1 < bVar3) && (table->IsInitializing == true)) &&
             (*(char *)((long)pIVar19 + lVar17 + -2) == '\0')) {
            fVar31 = *(float *)((long)pIVar19 + lVar17 + -0x52);
            fVar27 = table->MinColumnWidth * 4.0;
            uVar24 = -(uint)(fVar27 <= fVar31);
            *(uint *)((long)pIVar19 + lVar17 + -0x52) =
                 ~uVar24 & (uint)fVar27 | (uint)fVar31 & uVar24;
          }
          fVar30 = fVar30 + *(float *)((long)pIVar19 + lVar17 + -0x52);
        }
LAB_0018e57c:
        *(undefined1 *)((long)pIVar19 + lVar17 + -2) = 0;
        fVar30 = fVar30 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar13 = uVar13 + 1;
      lVar17 = lVar17 + 0x68;
    } while (uVar18 != uVar13);
  }
  table->ColumnsEnabledFixedCount = cVar16;
  fVar28 = (table->WorkRect).Min.x;
  fVar29 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar4 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar25 = (table->WorkRect).Max.x - fVar28;
  }
  else {
    fVar25 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar31 = (table->WorkRect).Min.y;
  fVar30 = (fVar25 - fVar29) - fVar30;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar29
  ;
  fVar29 = fVar30;
  if (0 < (int)uVar18) {
    uVar21 = table->EnabledMaskByIndex;
    lVar17 = 0x55;
    uVar13 = 0;
    do {
      if ((uVar21 >> (uVar13 & 0x3f) & 1) != 0) {
        pIVar19 = (table->Columns).Data;
        pIVar20 = (ImGuiTableColumn *)((long)pIVar19 + lVar17 + -0x55);
        if ((table->Columns).DataEnd <= pIVar20) goto LAB_0018ee7c;
        uVar24 = pIVar20->Flags;
        if ((uVar24 & 4) != 0) {
          fVar25 = (*(float *)((long)pIVar19 + lVar17 + -0x3d) / fVar26) * fVar30;
          uVar23 = -(uint)(table->MinColumnWidth <= fVar25);
          fVar25 = (float)(int)((float)(~uVar23 & (uint)table->MinColumnWidth |
                                       (uint)fVar25 & uVar23) + 0.01);
          *(float *)((long)pIVar19 + lVar17 + -0x45) = fVar25;
          fVar29 = fVar29 - fVar25;
        }
        if ((*(char *)((long)&pIVar19->Flags + lVar17) == -1) &&
           (table->LeftMostStretchedColumn != -1)) {
          pIVar20->Flags = uVar24 | 0x40000000;
        }
        fVar25 = *(float *)((long)pIVar19 + lVar17 + -0x45);
        uVar24 = -(uint)(table->MinColumnWidth <= fVar25);
        fVar25 = (float)(int)(float)(~uVar24 & (uint)table->MinColumnWidth | (uint)fVar25 & uVar24);
        *(float *)((long)pIVar19 + lVar17 + -0x51) = fVar25;
        table->ColumnsGivenWidth = fVar25 + table->ColumnsGivenWidth;
      }
      uVar13 = uVar13 + 1;
      lVar17 = lVar17 + 0x68;
    } while (uVar18 != uVar13);
  }
  if ((((uVar4 >> 0x13 & 1) == 0) && (1.0 <= fVar29)) &&
     ((1.0 <= fVar29 && ((0 < (int)uVar18 && (0.0 < fVar26)))))) {
    uVar21 = table->EnabledMaskByDisplayOrder;
    uVar13 = (ulong)uVar18;
    do {
      uVar10 = uVar13 - 1;
      if ((uVar21 >> (uVar10 & 0x3f) & 1) != 0) {
        pcVar14 = (table->DisplayOrderToIndex).Data + uVar10;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar14) goto LAB_0018ee93;
        lVar17 = (long)*pcVar14;
        if ((lVar17 < 0) ||
           (pIVar19 = (table->Columns).Data + lVar17, (table->Columns).DataEnd <= pIVar19))
        goto LAB_0018ee7c;
        if ((pIVar19->Flags & 4) != 0) {
          pIVar19->WidthRequest = pIVar19->WidthRequest + 1.0;
          pIVar19->WidthGiven = pIVar19->WidthGiven + 1.0;
          fVar29 = fVar29 + -1.0;
        }
      }
    } while (((0.0 < fVar26) && (1.0 <= fVar29)) &&
            (bVar8 = 1 < (long)uVar13, uVar13 = uVar10, bVar8));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar29 = (table->OuterRect).Max.y;
  fVar25 = table->LastOuterHeight + local_40.Min.y;
  uVar18 = -(uint)(fVar25 <= fVar29);
  local_40.Max.y = (float)(uVar18 & (uint)fVar29 | ~uVar18 & (uint)fVar25);
  bVar7 = ItemHoverable(&local_40,0);
  bVar8 = '\0' < table->FreezeColumnsCount;
  fVar29 = fVar28;
  if ('\0' < table->FreezeColumnsCount) {
    fVar29 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar21 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
LAB_0018eca8:
    if ((-1 < (long)table->RightMostEnabledColumn) &&
       (pIVar19 = (table->Columns).Data + table->RightMostEnabledColumn,
       pIVar19 < (table->Columns).DataEnd)) {
      fVar28 = (table->WorkRect).Min.x;
      fVar29 = (pIVar19->ClipRect).Max.x;
      uVar18 = -(uint)(fVar29 <= fVar28);
      fVar28 = (float)(~uVar18 & (uint)fVar29 | (uint)fVar28 & uVar18);
      if ((bVar7) && ((table->HoveredColumnBody == -1 && (fVar28 <= (local_48->IO).MousePos.x)))) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar21;
      }
      if ((bVar11) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      if (table->RightMostStretchedColumn != -1) {
        pbVar9 = (byte *)((long)&table->Flags + 2);
        *pbVar9 = *pbVar9 & 0xfe;
      }
      if ((table->Flags & 0x10000) != 0) {
        (table->WorkRect).Max.x = fVar28;
        (table->OuterRect).Max.x = fVar28;
        fVar29 = (table->InnerClipRect).Max.x;
        if (fVar28 <= fVar29) {
          fVar29 = fVar28;
        }
        (table->InnerClipRect).Max.x = fVar29;
      }
      pIVar5 = table->InnerWindow;
      IVar6 = (table->WorkRect).Max;
      (pIVar5->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar5->ParentWorkRect).Max = IVar6;
      fVar28 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar28;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar8 = BeginPopupEx(id,0x141);
        if (bVar8) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
        TableSortSpecsBuild(table);
      }
      pIVar5 = table->InnerWindow;
      if ((table->Flags & 0x100000) == 0) {
        ImDrawList::PushClipRect
                  (pIVar5->DrawList,(pIVar5->ClipRect).Min,(pIVar5->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,2);
      }
      return;
    }
LAB_0018ee7c:
    pcVar14 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
  }
  else {
    fVar29 = (fVar29 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar13 = 0;
    iVar15 = 0;
    while (pbVar9 = (byte *)((table->DisplayOrderToIndex).Data + uVar13),
          pbVar9 < (table->DisplayOrderToIndex).DataEnd) {
      bVar12 = *pbVar9;
      if (((long)(char)bVar12 < 0) ||
         (pIVar19 = (table->Columns).Data + (char)bVar12, (table->Columns).DataEnd <= pIVar19))
      goto LAB_0018ee7c;
      bVar22 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar22 = (char)bVar12 < table->FreezeColumnsCount;
      }
      pIVar19->NavLayerCurrent = bVar22;
      if ((bVar8) && (iVar15 == table->FreezeColumnsCount)) {
        fVar29 = fVar29 + (fVar28 - (table->OuterRect).Min.x);
        bVar8 = false;
      }
      pbVar9 = (byte *)((long)&pIVar19->Flags + 2);
      *pbVar9 = *pbVar9 & 0xf;
      if ((table->EnabledMaskByDisplayOrder >> (uVar13 & 0x3f) & 1) == 0) {
        (pIVar19->ClipRect).Max.x = fVar29;
        (pIVar19->ClipRect).Min.x = fVar29;
        pIVar19->WorkMinX = fVar29;
        pIVar19->MaxX = fVar29;
        pIVar19->MinX = fVar29;
        pIVar19->WidthGiven = 0.0;
        (pIVar19->ClipRect).Min.y = fVar31;
        (pIVar19->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar19->ClipRect,&local_58);
        pIVar19->IsVisibleX = false;
        pIVar19->IsVisibleY = false;
        pIVar19->IsRequestOutput = false;
        pIVar19->IsSkipItems = true;
        pIVar19->ItemWidth = 1.0;
      }
      else {
        if (((bVar7) && (fVar25 = (local_48->IO).MousePos.x, (pIVar19->ClipRect).Min.x <= fVar25))
           && (fVar25 < (pIVar19->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar12;
        }
        pIVar19->MinX = fVar29;
        fVar26 = TableGetMaxColumnWidth(table,(int)(char)bVar12);
        fVar25 = pIVar19->WidthGiven;
        if (fVar26 <= pIVar19->WidthGiven) {
          fVar25 = fVar26;
        }
        pIVar19->WidthGiven = fVar25;
        fVar26 = pIVar19->WidthRequest;
        if (table->MinColumnWidth <= pIVar19->WidthRequest) {
          fVar26 = table->MinColumnWidth;
        }
        fVar27 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                        (uint)fVar25 & -(uint)(fVar26 <= fVar25));
        pIVar19->WidthGiven = fVar27;
        fVar25 = table->CellPaddingX;
        fVar26 = table->CellSpacingX1;
        fVar30 = table->CellSpacingX2;
        fVar32 = fVar25 + fVar25 + fVar27 + fVar29 + fVar26 + fVar30;
        pIVar19->MaxX = fVar32;
        pIVar19->WorkMinX = fVar25 + pIVar19->MinX + fVar26;
        pIVar19->WorkMaxX = (fVar32 - fVar25) - fVar30;
        pIVar19->ItemWidth = (float)(int)(fVar27 * 0.65);
        (pIVar19->ClipRect).Min.x = pIVar19->MinX;
        (pIVar19->ClipRect).Min.y = fVar31;
        (pIVar19->ClipRect).Max.x = fVar32;
        (pIVar19->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar19->ClipRect,&local_58);
        fVar25 = (pIVar19->ClipRect).Min.x;
        fVar26 = (pIVar19->ClipRect).Max.x;
        pIVar19->IsVisibleX = fVar25 < fVar26;
        pIVar19->IsVisibleY = true;
        if (fVar26 <= fVar25) {
          if (pIVar19->AutoFitQueue != '\0') goto LAB_0018eb5d;
          bVar22 = pIVar19->CannotSkipItemsQueue != '\0';
          pIVar19->IsRequestOutput = bVar22;
          if (bVar22) goto LAB_0018eb69;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar12 & 0x3f);
LAB_0018eb5d:
          pIVar19->IsRequestOutput = true;
LAB_0018eb69:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar12 & 0x3f);
        }
        bVar22 = true;
        if (pIVar19->IsEnabled == true) {
          bVar22 = table->HostSkipItems;
        }
        pIVar19->IsSkipItems = bVar22;
        if (bVar22 == true && fVar25 < fVar26) {
          __assert_fail("!is_visible",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                        ,0x408,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        uVar18 = (uint)(fVar25 < fVar26) << 0x15 | pIVar19->Flags;
        pIVar19->Flags = uVar18 | 0x100000;
        if (pIVar19->SortOrder != -1) {
          pIVar19->Flags = uVar18 | 0x500000;
        }
        if (table->HoveredColumnBody == bVar12) {
          pbVar9 = (byte *)((long)&pIVar19->Flags + 2);
          *pbVar9 = *pbVar9 | 0x80;
        }
        fVar25 = pIVar19->WorkMinX;
        pIVar19->ContentMaxXUnfrozen = fVar25;
        pIVar19->ContentMaxXFrozen = fVar25;
        pIVar19->ContentMaxXHeadersIdeal = fVar25;
        pIVar19->ContentMaxXHeadersUsed = fVar25;
        if (table->HostSkipItems == false) {
          pIVar19->AutoFitQueue = pIVar19->AutoFitQueue >> 1;
          pIVar19->CannotSkipItemsQueue = pIVar19->CannotSkipItemsQueue >> 1;
        }
        if (iVar15 < table->FreezeColumnsCount) {
          fVar26 = pIVar19->MaxX + 1.0;
          fVar25 = local_58.Max.x;
          if (fVar26 <= local_58.Max.x) {
            fVar25 = fVar26;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar26 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar26 < local_58.Min.x) & (uint)fVar25);
        }
        fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX +
                          pIVar19->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar15 = iVar15 + 1;
      }
      uVar13 = uVar13 + 1;
      uVar21 = (ulong)table->ColumnsCount;
      if ((long)uVar21 <= (long)uVar13) goto LAB_0018eca8;
    }
LAB_0018ee93:
    pcVar14 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x23b,pcVar14);
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}